

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockpacking.h
# Opt level: O1

uint32_t * __thiscall
FastPForLib::FastBinaryPacking<32U>::decodeArray
          (FastBinaryPacking<32U> *this,uint32_t *in,size_t param_2,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint32_t i;
  long lVar2;
  uint32_t *out_00;
  uint32_t *puVar3;
  uint32_t *in_00;
  uint32_t Bs [4];
  uint local_48 [4];
  size_t *local_38;
  
  uVar1 = *in;
  in_00 = in + 1;
  puVar3 = out;
  local_38 = nvalue;
  if ((ulong)uVar1 != 0) {
    do {
      local_48[0] = (uint)*(byte *)((long)in_00 + 3);
      local_48[1] = (uint)*(byte *)((long)in_00 + 2);
      local_48[2] = (uint)*(byte *)((long)in_00 + 1);
      local_48[3] = (uint)(byte)*in_00;
      in_00 = in_00 + 1;
      lVar2 = 0;
      out_00 = puVar3;
      do {
        fastunpack(in_00,out_00,local_48[lVar2]);
        in_00 = in_00 + local_48[lVar2];
        lVar2 = lVar2 + 1;
        out_00 = out_00 + 0x20;
      } while (lVar2 != 4);
      puVar3 = puVar3 + 0x80;
    } while (puVar3 < out + uVar1);
  }
  *local_38 = (long)puVar3 - (long)out >> 2;
  return in_00;
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t /*length*/,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t actuallength = *in++;
    const uint32_t *const initout(out);
    uint32_t Bs[HowManyMiniBlocks];
    for (; out < initout + actuallength; out += BlockSize) {
      Bs[0] = static_cast<uint8_t>(in[0] >> 24);
      Bs[1] = static_cast<uint8_t>(in[0] >> 16);
      Bs[2] = static_cast<uint8_t>(in[0] >> 8);
      Bs[3] = static_cast<uint8_t>(in[0]);
      ++in;
      for (uint32_t i = 0; i < HowManyMiniBlocks; ++i) {
        if (MiniBlockSize == 8)
          in = fastunpack_8(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 16)
          in = fastunpack_16(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 24)
          in = fastunpack_24(in, out + i * MiniBlockSize, Bs[i]);
        else if (MiniBlockSize == 32) {
          fastunpack(in, out + i * MiniBlockSize, Bs[i]);
          in += Bs[i];
        } else
          throw std::logic_error("unsupported MiniBlockSize");
      }
    }
    nvalue = out - initout;
    return in;
  }